

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_flush_sparc64(CPUState *cpu)

{
  run_on_cpu_data tb_flush_count_00;
  undefined4 uStack_1c;
  uint tb_flush_count;
  CPUState *cpu_local;
  
  tb_flush_count_00.host_ulong._4_4_ = uStack_1c;
  tb_flush_count_00.host_int = (int)cpu->uc->tcg_ctx->gen_insn_data[0x156][1];
  do_tb_flush(cpu,tb_flush_count_00);
  return;
}

Assistant:

void tb_flush(CPUState *cpu)
{
    unsigned tb_flush_count = cpu->uc->tcg_ctx->tb_ctx.tb_flush_count;
    do_tb_flush(cpu, RUN_ON_CPU_HOST_INT(tb_flush_count));
}